

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::
BVHNMeshBuilderMorton
          (BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this,BVH *bvh,
          TriangleMesh *mesh,uint geomID,size_t minLeafSize,size_t maxLeafSize,
          size_t singleThreadThreshold)

{
  size_t sVar1;
  MemoryMonitorInterface *pMVar2;
  
  (this->super_Builder).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Builder).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__BVHNMeshBuilderMorton_021ee018;
  this->bvh = bvh;
  this->mesh = mesh;
  pMVar2 = &bvh->device->super_MemoryMonitorInterface;
  if (bvh->device == (Device *)0x0) {
    pMVar2 = (MemoryMonitorInterface *)0x0;
  }
  (this->morton).alloc.device = pMVar2;
  (this->morton).alloc.hugepages = false;
  sVar1 = 0x1c;
  if (maxLeafSize < 0x1c) {
    sVar1 = maxLeafSize;
  }
  (this->morton).size_active = 0;
  (this->morton).size_alloced = 0;
  (this->morton).items = (BuildPrim *)0x0;
  (this->settings).branchingFactor = 4;
  (this->settings).maxDepth = 0x20;
  (this->settings).minLeafSize = minLeafSize;
  (this->settings).maxLeafSize = sVar1;
  (this->settings).singleThreadThreshold = singleThreadThreshold;
  this->geomID_ = geomID;
  this->numPreviousPrimitives = 0;
  return;
}

Assistant:

BVHNMeshBuilderMorton (BVH* bvh, Mesh* mesh, unsigned int geomID, const size_t minLeafSize, const size_t maxLeafSize, const size_t singleThreadThreshold = DEFAULT_SINGLE_THREAD_THRESHOLD)
        : bvh(bvh), mesh(mesh), morton(bvh->device,0), settings(N,BVH::maxBuildDepth,minLeafSize,min(maxLeafSize,Primitive::max_size()*BVH::maxLeafBlocks),singleThreadThreshold), geomID_(geomID) {}